

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)74,(moira::Mode)10,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  Ea<(moira::Mode)10,_1> local_24;
  
  SVar1 = str->style->syntax;
  if (SVar1 - GNU < 2) {
    cVar3 = 'm';
    lVar5 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar3;
      cVar3 = "fdmove"[lVar5 + 3];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pcVar4 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar4 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar4 = '.';
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
    }
    *pcVar4 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar4 = str->ptr;
      do {
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
        pcVar4 = str->ptr;
      } while (pcVar4 < str->base + iVar2);
    }
    Op<(moira::Mode)10,2>((Ea<(moira::Mode)10,_2> *)&local_24,this,op & 7,addr);
    StrWriter::operator<<(str,(Ea<(moira::Mode)10,_2> *)&local_24);
  }
  else {
    if (SVar1 == MUSASHI) {
      cVar3 = 'm';
      lVar5 = 0;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar3;
        cVar3 = "fdmove"[lVar5 + 3];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar4 = str->ptr;
        do {
          str->ptr = pcVar4 + 1;
          *pcVar4 = ' ';
          pcVar4 = str->ptr;
        } while (pcVar4 < str->base + iVar2);
      }
    }
    else {
      cVar3 = 'm';
      lVar5 = 0;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar3;
        cVar3 = "fdmove"[lVar5 + 3];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      pcVar4 = str->ptr;
      SVar1 = str->style->syntax;
      str->ptr = pcVar4 + 1;
      if (2 < SVar1 - MOIRA_MIT) {
        *pcVar4 = '.';
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
      }
      *pcVar4 = 'w';
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar4 = str->ptr;
        do {
          str->ptr = pcVar4 + 1;
          *pcVar4 = ' ';
          pcVar4 = str->ptr;
        } while (pcVar4 < str->base + iVar2);
      }
    }
    Op<(moira::Mode)10,1>(&local_24,this,op & 7,addr);
    StrWriter::operator<<(str,&local_24);
  }
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str);
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = _____________xxx(op);

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, S>(src, addr) << Sep{} << Ccr{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
    }
}